

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forrest_tomlin.cc
# Opt level: O3

Int __thiscall ipx::ForrestTomlin::_Update(ForrestTomlin *this,double pivot)

{
  int iVar1;
  int *piVar2;
  pointer piVar3;
  pointer pdVar4;
  iterator __position;
  Int IVar5;
  ostream *poVar6;
  Int q1;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  pointer piVar11;
  pointer pdVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  fmtflags floatfield;
  pointer pdVar16;
  long lVar17;
  undefined8 in_R11;
  undefined7 uVar18;
  int iVar19;
  int iVar20;
  double dVar21;
  char local_81;
  double local_80;
  double local_78;
  undefined8 uStack_70;
  undefined4 local_64;
  double local_60;
  double local_58;
  string local_50;
  
  piVar2 = (this->U_).rowidx_queue_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar9 = (ulong)((long)(this->U_).rowidx_queue_.super__Vector_base<int,_std::allocator<int>_>.
                        _M_impl.super__Vector_impl_data._M_finish - (long)piVar2) >> 2;
  uVar14 = 0;
  iVar8 = this->replace_next_;
  pdVar16 = (pointer)(long)iVar8;
  uVar7 = (uint)uVar9;
  if ((int)uVar7 < 1) {
    local_64 = 0;
  }
  else {
    uVar18 = (undefined7)((ulong)in_R11 >> 8);
    local_64 = (undefined4)CONCAT71(uVar18,1);
    uVar14 = 0;
    if (*piVar2 != iVar8) {
      uVar10 = (ulong)(uVar7 & 0x7fffffff);
      uVar15 = 0;
      do {
        if (uVar10 - 1 == uVar15) {
          local_64 = (undefined4)CONCAT71(uVar18,uVar15 + 1 < uVar10);
          uVar14 = uVar9 & 0xffffffff;
          goto LAB_0039696b;
        }
        uVar14 = uVar15 + 1;
        lVar17 = uVar15 + 1;
        uVar15 = uVar14;
      } while (piVar2[lVar17] != iVar8);
      local_64 = (undefined4)CONCAT71(uVar18,uVar14 < uVar10);
    }
  }
LAB_0039696b:
  piVar11 = (this->U_).colptr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_58 = 0.0;
  local_60 = 0.0;
  uVar13 = (uint)uVar14;
  if (uVar13 != uVar7) {
    local_60 = (this->U_).values_queue_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[uVar14 & 0xffffffff];
  }
  pdVar12 = (this->U_).values_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start;
  lVar17 = (long)pdVar16 + 1;
  local_78 = (double)((ulong)((long)(this->replaced_).super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->replaced_).super__Vector_base<int,_std::allocator<int>_>.
                                   _M_impl.super__Vector_impl_data._M_start) >> 2);
  if (0 < (int)uVar7) {
    piVar3 = (this->R_).rowidx_queue_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar8 = (int)((ulong)((long)(this->R_).rowidx_queue_.
                                super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_finish - (long)piVar3) >> 2);
    if (0 < iVar8) {
      iVar20 = 0;
      iVar19 = 0;
      do {
        pdVar16 = (pointer)(long)iVar20;
        iVar1 = piVar3[iVar19];
        if (piVar2[(long)pdVar16] == iVar1) {
          local_58 = local_58 +
                     (this->U_).values_queue_.super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start[(long)pdVar16] *
                     (this->R_).values_queue_.super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start[iVar19];
          iVar20 = iVar20 + 1;
LAB_00396a1d:
          iVar19 = iVar19 + 1;
        }
        else {
          if (iVar1 <= piVar2[(long)pdVar16]) goto LAB_00396a1d;
          iVar20 = iVar20 + 1;
        }
      } while ((iVar20 < (int)uVar7) && (iVar19 < iVar8));
    }
  }
  floatfield = (fmtflags)pdVar16;
  local_80 = pivot * pdVar12[(long)piVar11[lVar17] + -1];
  if ((char)local_64 == '\0') {
    SparseMatrix::push_back(&this->U_,this->dim_ + local_78._0_4_,local_80);
    piVar11 = (this->U_).colptr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    pdVar12 = (this->U_).values_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
  }
  else {
    iVar8 = uVar7 - 1;
    pdVar4 = (this->U_).values_queue_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((int)uVar13 < iVar8) {
      uVar14 = uVar14 & 0xffffffff;
      pdVar16 = pdVar4 + uVar14 + 1;
      lVar17 = 0;
      do {
        piVar2[uVar14 + lVar17] = piVar2[uVar14 + lVar17 + 1];
        pdVar4[uVar14 + lVar17] = pdVar16[lVar17];
        lVar17 = lVar17 + 1;
      } while ((int)(uVar13 + (int)lVar17) < iVar8);
    }
    floatfield = (fmtflags)pdVar16;
    piVar2[iVar8] = this->dim_ + local_78._0_4_;
    pdVar4[iVar8] = local_80;
  }
  lVar17 = (long)this->replace_next_;
  iVar8 = piVar11[lVar17 + 1];
  iVar19 = piVar11[lVar17];
  if (iVar19 < iVar8 + -1) {
    memset(pdVar12 + iVar19,0,(ulong)((iVar8 - iVar19) - 2) * 8 + 8);
  }
  pdVar12[(long)iVar8 + -1] = 1.0;
  SparseMatrix::add_column(&this->U_);
  SparseMatrix::add_column(&this->R_);
  __position._M_current =
       (this->replaced_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->replaced_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&this->replaced_,__position,&this->replace_next_);
  }
  else {
    *__position._M_current = this->replace_next_;
    (this->replaced_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = __position._M_current + 1;
  }
  this->replace_next_ = -1;
  this->have_btran_ = false;
  this->have_ftran_ = false;
  IVar5 = -1;
  if ((local_80 != 0.0) || (NAN(local_80))) {
    piVar11 = (this->R_).colptr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    iVar8 = piVar11[local_78._0_4_];
    lVar17 = (long)iVar8;
    iVar19 = piVar11[(long)local_78._0_4_ + 1];
    if (iVar8 < iVar19) {
      dVar21 = 0.0;
      do {
        local_78 = ABS((this->R_).values_.super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_start[lVar17]);
        if (local_78 <= dVar21) {
          local_78 = dVar21;
        }
        lVar17 = lVar17 + 1;
        dVar21 = local_78;
      } while (iVar19 != lVar17);
      if (10000000000.0 < local_78) {
        uStack_70 = 0;
        poVar6 = Control::Debug(this->control_,3);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6," max eta = ",0xb);
        Format_abi_cxx11_(&local_50,(ipx *)0x0,local_78,2,0x100,floatfield);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar6,local_50._M_dataplus._M_p,local_50._M_string_length);
        local_81 = '\n';
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,&local_81,1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
      }
    }
    local_78 = ABS((local_80 - (local_60 - local_58)) / local_80);
    IVar5 = 0;
    if (1e-08 < local_78) {
      uStack_70 = 0;
      poVar6 = Control::Debug(this->control_,3);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar6," relative error in new diagonal entry of U = ",0x2d);
      Format_abi_cxx11_(&local_50,(ipx *)0x0,local_78,2,0x100,floatfield);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,local_50._M_dataplus._M_p,local_50._M_string_length);
      local_81 = '\n';
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,&local_81,1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      IVar5 = 1;
    }
  }
  return IVar5;
}

Assistant:

Int ForrestTomlin::_Update(double pivot) {
    Int num_updates = replaced_.size();
    assert(have_ftran_);
    assert(have_btran_);

    // Find the position of the entry with row index replace_next_ in spike.
    // If not present, we will have where == qend.
    assert(replace_next_ >= 0);
    Int qend = U_.queue_size();
    Int where = 0;
    while (where < qend && U_.qindex(where) != replace_next_)
        where++;

    // Compute new diagonal entry of U. newdiag1 will be inserted into U;
    // newdiag2 would be the same in exact arithmetic and is for monitoring
    // numerical stability.
    double olddiag = U_.value(U_.end(replace_next_)-1);
    double newdiag1 = pivot * olddiag;
    double newdiag2 = (where == qend ? 0.0 : U_.qvalue(where)) -
        SparseDot(U_, R_);
    double newdiag_err = std::abs(newdiag1-newdiag2);
    double rel_newdiag_err = newdiag_err / std::abs(newdiag1);

    // Put new diagonal entry at end of spike.
    if (where < qend) {
        for (Int l = where; l < qend-1; l++) {
            U_.qindex(l) = U_.qindex(l+1);
            U_.qvalue(l) = U_.qvalue(l+1);
        }
        U_.qindex(qend-1) = dim_+num_updates;
        U_.qvalue(qend-1) = newdiag1;
    } else {
        U_.push_back(dim_+num_updates, newdiag1);
    }

    // Overwrite replaced column by unit column in U.
    Int end = U_.end(replace_next_);
    for (Int l = U_.begin(replace_next_); l < end-1; l++)
        U_.value(l) = 0.0;
    U_.value(end-1) = 1.0;

    // Finish update.
    U_.add_column();
    R_.add_column();
    replaced_.push_back(replace_next_);
    replace_next_ = -1;
    have_btran_ = false;
    have_ftran_ = false;

    if (newdiag1 == 0.0)
        return -1;

    // Print a debugging message if a new eta entry is large.
    double max_eta = 0.0;
    for (Int l = R_.begin(num_updates); l < R_.end(num_updates); l++)
        max_eta = std::max(max_eta, std::abs(R_.value(l)));
    if (max_eta > 1e10)
        control_.Debug(3) << " max eta = " << sci2(max_eta) << '\n';

    // stability check
    if (rel_newdiag_err > kFtDiagErrorTol) {
        control_.Debug(3)
            << " relative error in new diagonal entry of U = "
            << sci2(rel_newdiag_err) << '\n';
        return 1;
    }
    return 0;
}